

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::Order
          (Relation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *expressions)

{
  string *psVar1;
  ParserOptions options;
  Relation *pRVar2;
  ClientContext *this_00;
  reference __args;
  ParserException *pPVar3;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *select_list;
  shared_ptr<duckdb::Relation,_true> sVar4;
  allocator local_c9;
  vector<duckdb::OrderByNode,_true> order_list;
  string local_b0;
  vector<duckdb::OrderByNode,_true> *local_90;
  Relation *local_88;
  vector<duckdb::OrderByNode,_true> inner_list;
  vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> local_68;
  ParserOptions local_48;
  
  select_list = (string *)*in_RDX;
  psVar1 = (string *)in_RDX[1];
  local_88 = this;
  if (select_list == psVar1) {
    pPVar3 = (ParserException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_b0,"Zero ORDER BY expressions provided",(allocator *)&order_list);
    ParserException::ParserException(pPVar3,&local_b0);
    __cxa_throw(pPVar3,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  }
  order_list.super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  order_list.super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  order_list.super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
  super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = (vector<duckdb::OrderByNode,_true> *)expressions;
  while( true ) {
    pRVar2 = local_88;
    if (select_list == psVar1) {
      local_68.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_start =
           order_list.super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_68.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_finish =
           order_list.super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_68.super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage =
           order_list.super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
           super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      order_list.super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      order_list.super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      order_list.super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Order(local_88,local_90);
      ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector(&local_68);
      ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
                (&order_list.super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>
                );
      sVar4.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      sVar4.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           pRVar2;
      return (shared_ptr<duckdb::Relation,_true>)
             sVar4.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
    }
    shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
              ((shared_ptr<duckdb::ClientContextWrapper,_true> *)(expressions + 1));
    ClientContextWrapper::GetContext((ClientContextWrapper *)&local_b0);
    this_00 = shared_ptr<duckdb::ClientContext,_true>::operator->
                        ((shared_ptr<duckdb::ClientContext,_true> *)&local_b0);
    ClientContext::GetParserOptions(&local_48,this_00);
    options.max_expression_depth = local_48.max_expression_depth;
    options.preserve_identifier_case = local_48.preserve_identifier_case;
    options.integer_division = local_48.integer_division;
    options._2_6_ = local_48._2_6_;
    options.extensions = local_48.extensions;
    Parser::ParseOrderList
              ((vector<duckdb::OrderByNode,_true> *)
               &inner_list.super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>,
               select_list,options);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b0._M_string_length);
    if ((long)inner_list.super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)inner_list.super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start != 0x10) break;
    __args = vector<duckdb::OrderByNode,_true>::get<true>
                       ((vector<duckdb::OrderByNode,_true> *)
                        &inner_list.
                         super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>,0);
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::
    emplace_back<duckdb::OrderByNode>
              (&order_list.super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>,
               __args);
    ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::~vector
              (&inner_list.super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>);
    select_list = select_list + 1;
  }
  pPVar3 = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_b0,"Expected a single ORDER BY expression in the expression list",
             &local_c9);
  ParserException::ParserException(pPVar3,&local_b0);
  __cxa_throw(pPVar3,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<Relation> Relation::Order(const vector<string> &expressions) {
	if (expressions.empty()) {
		throw ParserException("Zero ORDER BY expressions provided");
	}
	vector<OrderByNode> order_list;
	for (auto &expression : expressions) {
		auto inner_list = Parser::ParseOrderList(expression, context->GetContext()->GetParserOptions());
		if (inner_list.size() != 1) {
			throw ParserException("Expected a single ORDER BY expression in the expression list");
		}
		order_list.push_back(std::move(inner_list[0]));
	}
	return Order(std::move(order_list));
}